

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::GetMotorCurrent(AmpIO *this,uint index,double *amps)

{
  uint32_t uVar1;
  bool bVar2;
  double Bits2AmpsQLA;
  uint32_t bits;
  double *amps_local;
  uint index_local;
  AmpIO *this_local;
  
  bVar2 = index < this->NumMotors;
  if (bVar2) {
    uVar1 = GetMotorCurrent(this,index);
    *amps = (double)uVar1 * 0.00019073486328125 + -6.25;
  }
  return bVar2;
}

Assistant:

bool AmpIO::GetMotorCurrent(unsigned int index, double &amps) const
{
    if (index >= NumMotors)
        return false;
    uint32_t bits = GetMotorCurrent(index);
    const double Bits2AmpsQLA = (2.5*5.0/65536);
    amps = bits*Bits2AmpsQLA - 6.25;
    return true;
}